

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CaseInsensitive::Transform::Apply<char16_t>(Transform *this,uint c,char16_t *outEquiv)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar8 = this->lo;
  if ((c < uVar8) || (this->hi < c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x29,"(c >= lo && c <= hi)","c >= lo && c <= hi");
    if (!bVar3) goto LAB_00e57a34;
    *puVar4 = 0;
    uVar8 = this->lo;
  }
  bVar1 = this->skipCountOfRange;
  iVar7 = 0;
  uVar6 = c % (uint)bVar1;
  if ((uVar8 + 1) % (uint)bVar1 == uVar6) {
    iVar7 = this->delta0;
  }
  if (0xffff < iVar7 + c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
    if (!bVar3) goto LAB_00e57a34;
    *puVar4 = 0;
    uVar8 = this->lo;
    bVar1 = this->skipCountOfRange;
    uVar6 = c % (uint)bVar1;
  }
  *outEquiv = (char16_t)(iVar7 + c);
  if (uVar8 % (uint)bVar1 == uVar6) {
    uVar8 = this->delta1 + c;
    if (0xffff < uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar3) goto LAB_00e57a34;
      *puVar4 = 0;
    }
    outEquiv[1] = (char16_t)uVar8;
    uVar8 = this->delta2 + c;
    if (0xffff < uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar3) goto LAB_00e57a34;
      *puVar4 = 0;
    }
    outEquiv[2] = (char16_t)uVar8;
    c = c + this->delta3;
    if (0xffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x8f,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar3) {
LAB_00e57a34:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    lVar5 = 6;
  }
  else {
    if (0xffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar3) goto LAB_00e57a34;
      *puVar4 = 0;
    }
    outEquiv[3] = (char16_t)c;
    outEquiv[2] = (char16_t)c;
    lVar5 = 2;
  }
  *(short *)((long)outEquiv + lVar5) = (short)c;
  return;
}

Assistant:

inline void Apply(uint c, Char outEquiv[EquivClassSize]) const
            {
                Assert(c >= lo && c <= hi);

                outEquiv[0] = Chars<Char>::UTC((lo + 1) % skipCountOfRange == c % skipCountOfRange ? (int)c + delta0 : c);

                CompileAssert(CaseInsensitive::EquivClassSize == 4);
                if (lo  % skipCountOfRange == c % skipCountOfRange)
                {
                    outEquiv[1] = Chars<Char>::ITC((int)c + delta1);
                    outEquiv[2] = Chars<Char>::ITC((int)c + delta2);
                    outEquiv[3] = Chars<Char>::ITC((int)c + delta3);
                }
                else
                {
                    outEquiv[1] = outEquiv[2] = outEquiv[3] = Chars<Char>::UTC(c);
                }
            }